

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

void getLogTime(char *timeResult,size_t len)

{
  tm *__tp;
  size_t sVar1;
  tm *tmInfo;
  time_t agent_time;
  size_t len_local;
  char *timeResult_local;
  
  if (timeResult != (char *)0x0) {
    agent_time = len;
    len_local = (size_t)timeResult;
    tmInfo = (tm *)get_time((time_t *)0x0);
    if (tmInfo == (tm *)0xffffffffffffffff) {
      *(undefined1 *)len_local = 0;
    }
    else {
      __tp = localtime((time_t *)&tmInfo);
      if (__tp == (tm *)0x0) {
        *(undefined1 *)len_local = 0;
      }
      else {
        sVar1 = strftime((char *)len_local,agent_time,"%H:%M:%S",__tp);
        if (sVar1 == 0) {
          *(undefined1 *)len_local = 0;
        }
      }
    }
  }
  return;
}

Assistant:

static void getLogTime(char* timeResult, size_t len)
{
    if (timeResult != NULL)
    {
        time_t agent_time = get_time(NULL);
        if (agent_time == (time_t)-1)
        {
            timeResult[0] = '\0';
        }
        else
        {
            struct tm* tmInfo = localtime(&agent_time);
            if (tmInfo == NULL)
            {
                timeResult[0] = '\0';
            }
            else
            {
                if (strftime(timeResult, len, "%H:%M:%S", tmInfo) == 0)
                {
                    timeResult[0] = '\0';
                }
            }
        }
    }
}